

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::InitMoc(cmQtAutoGenInitializer *this)

{
  string *psVar1;
  uint uVar2;
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  bool bVar4;
  mapped_type *pmVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  pointer pbVar6;
  string *cfg;
  pointer pbVar7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  undefined1 local_a8 [8];
  pointer pbStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Base_ptr p_Stack_88;
  size_t local_80;
  undefined1 local_78 [40];
  cmLocalGenerator *local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_48;
  pointer local_40;
  string *local_38;
  
  this_00 = this->Target->Target->Makefile;
  local_50 = cmGeneratorTarget::GetLocalGenerator(this->Target);
  psVar1 = &(this->Moc).MocsCompilation;
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  pcVar3 = this->Target;
  local_a8 = (undefined1  [8])&local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"AUTOMOC_COMPILER_PREDEFINES","");
  bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)local_a8);
  if (bVar4) {
    uVar2 = (this->QtVersion).Major;
    bVar4 = true;
    if (uVar2 < 6) {
      if (uVar2 == 5) {
        bVar4 = 7 < (this->QtVersion).Minor;
      }
      else {
        bVar4 = false;
      }
    }
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if (!bVar4) goto LAB_002432bb;
    local_a8 = (undefined1  [8])&local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"CMAKE_CXX_COMPILER_PREDEFINES_COMMAND","");
    cmMakefile::GetSafeDefinition(this_00,(string *)local_a8);
    std::__cxx11::string::_M_assign((string *)&(this->Moc).PredefsCmd);
  }
  if (local_a8 != (undefined1  [8])&local_98) {
    operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
  }
LAB_002432bb:
  uVar2 = (this->QtVersion).Major;
  local_40 = (pointer)CONCAT44(local_40._4_4_,uVar2);
  psVar1 = &this->ConfigDefault;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  local_78._16_8_ = (pointer)0x0;
  local_98._M_allocated_capacity._0_4_ = 0x585843;
  pbStack_a0 = (pointer)0x3;
  local_a8 = (undefined1  [8])&local_98;
  cmLocalGenerator::GetIncludeDirectoriesImplicit
            (local_50,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_78,this->Target,(string *)local_a8,psVar1,false,4 < uVar2);
  local_38 = psVar1;
  if (local_a8 != (undefined1  [8])&local_98) {
    operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
  }
  local_98._M_allocated_capacity =
       (size_type)
       (this->Moc).Includes.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Moc).Includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_78._16_8_;
  local_a8 = (undefined1  [8])
             (this->Moc).Includes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbStack_a0 = (this->Moc).Includes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  (this->Moc).Includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
  (this->Moc).Includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  local_78._16_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  if (this->MultiConfig == true) {
    pbVar6 = (this->ConfigsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = (this->ConfigsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar6 != pbVar7) {
      local_48 = &(this->Moc).ConfigIncludes;
      do {
        local_78._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78._16_8_ = (pointer)0x0;
        pbStack_a0 = (pointer)0x3;
        local_98._M_allocated_capacity._0_4_ = 0x585843;
        local_a8 = (undefined1  [8])&local_98;
        cmLocalGenerator::GetIncludeDirectoriesImplicit
                  (local_50,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,this->Target,(string *)local_a8,pbVar6,false,
                   4 < (uint)local_40);
        if (local_a8 != (undefined1  [8])&local_98) {
          operator_delete((void *)local_a8,(ulong)(local_98._M_allocated_capacity + 1));
        }
        __first2 = (this->Moc).Includes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (local_78._8_8_ - local_78._0_8_ ==
            (long)(this->Moc).Includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
          bVar4 = std::__equal<false>::
                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_78._0_8_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_78._8_8_,__first2);
          if (!bVar4) goto LAB_00243452;
        }
        else {
LAB_00243452:
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::operator[](local_48,pbVar6);
          local_98._M_allocated_capacity =
               (size_type)
               (pmVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_a8 = (undefined1  [8])
                     (pmVar5->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          pbStack_a0 = (pmVar5->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
          (pmVar5->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
          (pmVar5->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
          (pmVar5->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_78._16_8_;
          local_78._0_8_ = (pointer)0x0;
          local_78._8_8_ = (pointer)0x0;
          local_78._16_8_ = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar7);
    }
  }
  local_98._8_8_ = &pbStack_a0;
  pbStack_a0 = (pointer)((ulong)pbStack_a0 & 0xffffffff00000000);
  local_98._M_allocated_capacity = 0;
  local_80 = 0;
  pbVar6 = (pointer)(local_78 + 0x10);
  local_78._16_4_ = 0x585843;
  local_78._8_8_ = (pointer)0x3;
  p_Stack_88 = (_Base_ptr)local_98._8_8_;
  local_78._0_8_ = pbVar6;
  cmLocalGenerator::GetTargetDefines
            (local_50,this->Target,local_38,(string *)local_78,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8);
  if ((pointer)local_78._0_8_ != pbVar6) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->Moc).Defines._M_t);
  if ((_Base_ptr)local_98._M_allocated_capacity != (_Base_ptr)0x0) {
    (this->Moc).Defines._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)pbStack_a0;
    (this->Moc).Defines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_98._M_allocated_capacity;
    (this->Moc).Defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_98._8_8_;
    (this->Moc).Defines._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_88;
    *(_Rb_tree_header **)(local_98._M_allocated_capacity + 8) =
         &(this->Moc).Defines._M_t._M_impl.super__Rb_tree_header;
    (this->Moc).Defines._M_t._M_impl.super__Rb_tree_header._M_node_count = local_80;
    local_98._M_allocated_capacity = 0;
    local_98._8_8_ = &pbStack_a0;
    local_80 = 0;
    p_Stack_88 = (_Base_ptr)local_98._8_8_;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
  if (this->MultiConfig == true) {
    pbVar7 = (this->ConfigsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (this->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar7 != local_40) {
      local_48 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)&(this->Moc).ConfigDefines;
      do {
        pbStack_a0 = (pointer)((ulong)pbStack_a0 & 0xffffffff00000000);
        local_98._M_allocated_capacity = 0;
        local_98._8_8_ = &pbStack_a0;
        local_80 = 0;
        local_78._8_8_ = (pointer)0x3;
        local_78._16_4_ = 0x585843;
        p_Stack_88 = (_Base_ptr)local_98._8_8_;
        local_78._0_8_ = pbVar6;
        cmLocalGenerator::GetTargetDefines
                  (local_50,this->Target,pbVar7,(string *)local_78,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8);
        if ((pointer)local_78._0_8_ != pbVar6) {
          operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
        }
        if (local_80 == (this->Moc).Defines._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          bVar4 = std::__equal<false>::
                  equal<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                            ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_98._8_8_,(_Base_ptr)&pbStack_a0,
                             (this->Moc).Defines._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left);
          if (!bVar4) goto LAB_00243659;
        }
        else {
LAB_00243659:
          this_01 = &std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                   *)local_48,pbVar7)->_M_t;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(this_01);
          if ((_Base_ptr)local_98._M_allocated_capacity != (_Base_ptr)0x0) {
            (this_01->_M_impl).super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)pbStack_a0
            ;
            (this_01->_M_impl).super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)local_98._M_allocated_capacity;
            (this_01->_M_impl).super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_98._8_8_;
            (this_01->_M_impl).super__Rb_tree_header._M_header._M_right = p_Stack_88;
            *(_Rb_tree_header **)(local_98._M_allocated_capacity + 8) =
                 &(this_01->_M_impl).super__Rb_tree_header;
            (this_01->_M_impl).super__Rb_tree_header._M_node_count = local_80;
            local_98._M_allocated_capacity = 0;
            local_98._8_8_ = &pbStack_a0;
            local_80 = 0;
            p_Stack_88 = (_Base_ptr)local_98._8_8_;
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != local_40);
    }
  }
  local_a8 = (undefined1  [8])&local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"moc","");
  bVar4 = GetQtExecutable(this,&(this->Moc).super_GenVarsT,(string *)local_a8,false,(string *)0x0);
  if (local_a8 != (undefined1  [8])&local_98) {
    operator_delete((void *)local_a8,(ulong)(local_98._M_allocated_capacity + 1));
  }
  if ((bVar4) &&
     (pcVar3 = (this->Moc).super_GenVarsT.ExecutableTarget, pcVar3 != (cmGeneratorTarget *)0x0)) {
    std::
    _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
    ::_M_insert_unique<cmTarget*const&>
              ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                *)&(this->AutogenTarget).DependTargets,&pcVar3->Target);
  }
  return bVar4;
}

Assistant:

bool cmQtAutoGenInitializer::InitMoc()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmLocalGenerator* localGen = this->Target->GetLocalGenerator();

  // Mocs compilation file
  this->Moc.MocsCompilation = this->Dir.Build;
  this->Moc.MocsCompilation += "/mocs_compilation.cpp";

  // Moc predefs command
  if (this->Target->GetPropertyAsBool("AUTOMOC_COMPILER_PREDEFINES") &&
      (this->QtVersion >= IntegerVersion(5, 8))) {
    this->Moc.PredefsCmd =
      makefile->GetSafeDefinition("CMAKE_CXX_COMPILER_PREDEFINES_COMMAND");
  }

  // Moc includes
  {
    bool const appendImplicit = (this->QtVersion.Major >= 5);
    auto GetIncludeDirs =
      [this, localGen,
       appendImplicit](std::string const& cfg) -> std::vector<std::string> {
      // Get the include dirs for this target, without stripping the implicit
      // include dirs off, see
      // https://gitlab.kitware.com/cmake/cmake/issues/13667
      std::vector<std::string> dirs;
      localGen->GetIncludeDirectoriesImplicit(dirs, this->Target, "CXX", cfg,
                                              false, appendImplicit);
      return dirs;
    };

    // Default configuration include directories
    this->Moc.Includes = GetIncludeDirs(this->ConfigDefault);
    // Other configuration settings
    if (this->MultiConfig) {
      for (std::string const& cfg : this->ConfigsList) {
        std::vector<std::string> dirs = GetIncludeDirs(cfg);
        if (dirs != this->Moc.Includes) {
          this->Moc.ConfigIncludes[cfg] = std::move(dirs);
        }
      }
    }
  }

  // Moc compile definitions
  {
    auto GetCompileDefinitions =
      [this, localGen](std::string const& cfg) -> std::set<std::string> {
      std::set<std::string> defines;
      localGen->GetTargetDefines(this->Target, cfg, "CXX", defines);
#ifdef _WIN32
      if (this->Moc.PredefsCmd.empty()) {
        // Add WIN32 definition if we don't have a moc_predefs.h
        defines.insert("WIN32");
      }
#endif
      return defines;
    };

    // Default configuration defines
    this->Moc.Defines = GetCompileDefinitions(this->ConfigDefault);
    // Other configuration defines
    if (this->MultiConfig) {
      for (std::string const& cfg : this->ConfigsList) {
        std::set<std::string> defines = GetCompileDefinitions(cfg);
        if (defines != this->Moc.Defines) {
          this->Moc.ConfigDefines[cfg] = std::move(defines);
        }
      }
    }
  }

  // Moc executable
  {
    if (!this->GetQtExecutable(this->Moc, "moc", false, nullptr)) {
      return false;
    }
    // Let the _autogen target depend on the moc executable
    if (this->Moc.ExecutableTarget != nullptr) {
      this->AutogenTarget.DependTargets.insert(
        this->Moc.ExecutableTarget->Target);
    }
  }

  return true;
}